

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O3

Matrix3d *
CIF::Utilities::generateRotationMatrix<double>
          (Matrix3d *__return_storage_ptr__,Vector3d *ax,double theta)

{
  double *s;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar1;
  ActualDstType actualDst;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Matrix3d c;
  double local_f8;
  Scalar local_f0;
  Scalar local_e8;
  double local_e0;
  Scalar local_d8;
  Matrix<double,_3,_3,_0,_3,_3> *local_d0;
  long local_c8;
  LhsNested local_c0;
  long local_b8;
  scalar_constant_op<double> local_b0;
  Matrix<double,_3,_3,_0,_3,_3> *local_98;
  Matrix<double,_3,_3,_0,_3,_3> *local_90;
  scalar_constant_op<double> local_80;
  Matrix<double,_3,_3,_0,_3,_3> local_68;
  
  auVar4 = *(undefined1 (*) [16])
            (ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array;
  local_f8 = (ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
  auVar5._0_8_ = local_f8 * local_f8 + auVar4._8_8_ * auVar4._8_8_ + auVar4._0_8_ * auVar4._0_8_;
  if (0.0 < auVar5._0_8_) {
    auVar5._8_8_ = 0;
    auVar5 = sqrtpd(auVar5,auVar5);
    auVar6._0_8_ = auVar5._0_8_;
    local_f8 = local_f8 / auVar6._0_8_;
    auVar6._8_8_ = auVar6._0_8_;
    auVar4 = divpd(auVar4,auVar6);
    *(undefined1 (*) [16])
     (ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array =
         auVar4;
    (ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_f8;
  }
  local_c8 = 0;
  local_c0 = (LhsNested)0x1;
  local_b8 = 1;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_f8 = -local_f8;
  local_d0 = &local_68;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_d0,&local_f8
                     );
  s = (ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array + 1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,s);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + 2);
  local_d8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_d8);
  local_e0 = -(ax->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_e0);
  local_e8 = -*s;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_e8);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(Scalar *)ax);
  local_f0 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&local_f0);
  if ((local_b8 + local_c8 == 3) && (local_c0 == (LhsNested)0x3)) {
    dVar2 = sin(theta);
    dVar3 = cos(theta);
    local_80.m_other = 1.0 - dVar3;
    local_c0 = &local_68;
    local_b0.m_other = dVar2;
    local_98 = &local_68;
    local_90 = &local_68;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const>,Eigen::internal::assign_op<double,double>>
              (__return_storage_ptr__,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)&local_d0,(assign_op<double,_double> *)&local_f8);
    return __return_storage_ptr__;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
               );
}

Assistant:

Eigen::Matrix3d generateRotationMatrix(Eigen::Vector3d ax, double theta) {
        // https://computergraphics.stackexchange.com/a/2404
        // normalize otherwise our rotation will modify the magnitude?
        ax.normalize();

        Eigen::Matrix3d c;
        c << 0.0, -ax(2), ax(1),
                ax(2), 0.0, -ax(0),
                -ax(1), ax(0), 0.0;

        return Eigen::Matrix3d::Identity() + c * std::sin(theta) + c * c * (1 - std::cos(theta));
    }